

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::App::get_option_no_throw(App *this,string *option_name)

{
  pointer puVar1;
  pointer psVar2;
  App *this_00;
  bool bVar3;
  Option *pOVar4;
  shared_ptr<CLI::App> *subc;
  pointer psVar5;
  pointer puVar6;
  string local_50;
  
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    bVar3 = Option::check_name((puVar6->_M_t).
                               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                               .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,option_name
                              );
    if (bVar3) {
      return (puVar6->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    }
  }
  psVar5 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar5 == psVar2) {
      return (Option *)0x0;
    }
    this_00 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((this_00->name_)._M_string_length == 0) {
      ::std::__cxx11::string::string((string *)&local_50,(string *)option_name);
      pOVar4 = get_option_no_throw(this_00,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (pOVar4 != (Option *)0x0) {
        return pOVar4;
      }
    }
    psVar5 = psVar5 + 1;
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const Option *App::get_option_no_throw(std::string option_name) const noexcept {
    for(const Option_p &opt : options_) {
        if(opt->check_name(option_name)) {
            return opt.get();
        }
    }
    for(const auto &subc : subcommands_) {
        // also check down into nameless subcommands
        if(subc->get_name().empty()) {
            auto *opt = subc->get_option_no_throw(option_name);
            if(opt != nullptr) {
                return opt;
            }
        }
    }
    return nullptr;
}